

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  
  uVar1 = *(uint *)&pNode->field_0x14;
  if ((uVar1 & 0x10) != 0) {
    return;
  }
  if ((uVar1 & 0xf) == 7) {
    Abc_NodeConeMarkCollect_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vVisited);
    Abc_NodeConeMarkCollect_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vVisited);
    uVar1 = *(uint *)&pNode->field_0x14;
  }
  if ((uVar1 & 0x10) == 0) {
    *(uint *)&pNode->field_0x14 = uVar1 | 0x10;
    Vec_PtrPush(vVisited,pNode);
    return;
  }
  __assert_fail("pNode->fMarkA == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                ,0x1e5,"void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NodeConeMarkCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    if ( pNode->fMarkA == 1 )
        return;
    // visit transitive fanin 
    if ( Abc_ObjIsNode(pNode) )
    {
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin0(pNode), vVisited );
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin1(pNode), vVisited );
    }
    assert( pNode->fMarkA == 0 );
    pNode->fMarkA = 1;
    Vec_PtrPush( vVisited, pNode );
}